

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void soplex::
     LPFwriteSVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *p_svec,bool writeZeroCoefficients)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  int i;
  cpp_dec_float<200U,_int,_void> *this;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  byte bVar8;
  char name [16];
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  coeff;
  char local_148 [24];
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar8 = 0;
  if (0 < (p_lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    i = 0;
    iVar6 = 0;
    do {
      this = &local_b0;
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)this,p_svec,i);
      if (local_b0.fpclass == cpp_dec_float_NaN) {
LAB_00147b6d:
        if (iVar6 == 0) {
          poVar4 = boost::multiprecision::operator<<
                             (p_output,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)this);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pcVar2 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)(p_lp->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set.thekey,i,p_cnames,local_148);
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
          }
          else {
            sVar3 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar3);
          }
        }
        else {
          if (iVar6 * -0x33333333 + 0x19999999U < 0x33333333) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n\t",2);
          }
          if (local_b0.fpclass == cpp_dec_float_NaN) {
LAB_00147bc9:
            std::__ostream_insert<char,std::char_traits<char>>(p_output," + ",3);
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_130,0,(type *)0x0);
            iVar1 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (this,&local_130);
            if (-1 < iVar1) goto LAB_00147bc9;
            std::__ostream_insert<char,std::char_traits<char>>(p_output," - ",3);
            pcVar7 = &local_130;
            for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
              (pcVar7->data)._M_elems[0] = (this->data)._M_elems[0];
              this = (cpp_dec_float<200U,_int,_void> *)((long)this + (ulong)bVar8 * -8 + 4);
              pcVar7 = (cpp_dec_float<200U,_int,_void> *)
                       ((long)pcVar7 + ((ulong)bVar8 * -2 + 1) * 4);
            }
            local_130.neg = local_b0.neg;
            if (local_b0.fpclass != cpp_dec_float_finite || local_130.data._M_elems[0] != 0) {
              local_130.neg = (bool)(local_b0.neg ^ 1);
            }
            this = &local_130;
          }
          boost::multiprecision::operator<<
                    (p_output,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)this);
          std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
          pcVar2 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)(p_lp->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set.thekey,i,p_cnames,local_148);
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)p_output + (int)*(undefined8 *)(*(long *)p_output + -0x18));
          }
          else {
            sVar3 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar2,sVar3);
          }
        }
        iVar6 = iVar6 + 1;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_130,0,(type *)0x0);
        iVar1 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (this,&local_130);
        if (writeZeroCoefficients || iVar1 != 0) goto LAB_00147b6d;
      }
      i = i + 1;
    } while (i < (p_lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  }
  return;
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<R>&   p_lp,                         ///< the LP
   std::ostream&         p_output,                     ///< output stream
   const NameSet*        p_cnames,                     ///< column names
   const SVectorBase<R>& p_svec,                       ///< vector to write
   const bool            writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const R coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns
         if(num_coeffs % SOPLEX_NUM_ENTRIES_PER_LINE == 0)
            p_output << "\n\t";

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}